

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

int __thiscall phosg::unlink(phosg *this,char *__name)

{
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint *puVar4;
  runtime_error *prVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Hash_node_base *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  undefined1 local_68 [56];
  
  if ((int)__name != 0) {
    bVar1 = isdir((string *)this);
    if (bVar1) {
      list_directory((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68,(string *)this);
      if ((_Hash_node_base *)local_68._16_8_ != (_Hash_node_base *)0x0) {
        p_Var7 = (_Hash_node_base *)local_68._16_8_;
        do {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,*(long *)this,*(long *)(this + 8) + *(long *)this);
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_a8,"/");
          pbVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::_M_append(&local_a8,(char *)p_Var7[1]._M_nxt,(size_type)p_Var7[2]._M_nxt);
          local_c8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
          paVar6 = &pbVar3->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p == paVar6) {
            local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_c8._M_string_length = pbVar3->_M_string_length;
          (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar3->_M_string_length = 0;
          (pbVar3->field_2)._M_local_buf[0] = '\0';
          unlink((phosg *)&local_c8,(char *)0x1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = p_Var7->_M_nxt;
        } while (p_Var7 != (_Hash_node_base *)0x0);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_68);
      uVar2 = rmdir(*(char **)this);
      puVar4 = (uint *)(ulong)uVar2;
      if (uVar2 != 0) {
        puVar4 = (uint *)__errno_location();
        if (*puVar4 != 2) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a8,"can\'t delete directory ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                          );
          pbVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::append(&local_a8,": ");
          local_c8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
          paVar6 = &pbVar3->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p == paVar6) {
            local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_c8._M_string_length = pbVar3->_M_string_length;
          (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar3->_M_string_length = 0;
          (pbVar3->field_2)._M_local_buf[0] = '\0';
          string_for_error_abi_cxx11_
                    (&local_88,(phosg *)(ulong)*puVar4,(int)local_c8._M_string_length);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,&local_c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_88);
          ::std::runtime_error::runtime_error(prVar5,(string *)local_68);
          __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      goto LAB_00116e8a;
    }
  }
  uVar2 = ::unlink(*(char **)this);
  puVar4 = (uint *)(ulong)uVar2;
  if (uVar2 != 0) {
    puVar4 = (uint *)__errno_location();
    if (*puVar4 != 2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a8,"can\'t delete file ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      pbVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_a8,": ");
      local_c8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar6 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == paVar6) {
        local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_c8._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      string_for_error_abi_cxx11_(&local_88,(phosg *)(ulong)*puVar4,(int)local_c8._M_string_length);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_88);
      ::std::runtime_error::runtime_error(prVar5,(string *)local_68);
      __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
LAB_00116e8a:
  return (int)puVar4;
}

Assistant:

void unlink(const string& filename, bool recursive) {
  if (recursive) {
    if (isdir(filename)) {
      for (const string& item : list_directory(filename)) {
        unlink(filename + "/" + item, true);
      }
      if ((::rmdir(filename.c_str()) != 0) && (errno != ENOENT)) {
        throw runtime_error("can\'t delete directory " + filename + ": " + string_for_error(errno));
      }
    } else {
      unlink(filename, false);
    }

  } else {
    if ((::unlink(filename.c_str()) != 0) && (errno != ENOENT)) {
      throw runtime_error("can\'t delete file " + filename + ": " + string_for_error(errno));
    }
  }
}